

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8 *target)

{
  bool bVar1;
  int size_00;
  LogMessage *other;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  undefined1 local_60 [8];
  CodedOutputStream coded_out;
  ArrayOutputStream out;
  int size;
  uint8 *target_local;
  MessageLite *this_local;
  
  size_00 = (*this->_vptr_MessageLite[0xc])();
  io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&coded_out.had_error_,target,size_00,-1);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)local_60,(ZeroCopyOutputStream *)&coded_out.had_error_);
  (*this->_vptr_MessageLite[10])(this,local_60);
  local_a9 = 0;
  bVar1 = io::CodedOutputStream::HadError((CodedOutputStream *)local_60);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message_lite.cc"
               ,0xe0);
    local_a9 = 1;
    other = internal::LogMessage::operator<<(&local_a8,"CHECK failed: !coded_out.HadError(): ");
    internal::LogFinisher::operator=(&local_aa,other);
  }
  if ((local_a9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_60);
  io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&coded_out.had_error_);
  return target + size_00;
}

Assistant:

uint8* MessageLite::SerializeWithCachedSizesToArray(uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  int size = GetCachedSize();
  io::ArrayOutputStream out(target, size);
  io::CodedOutputStream coded_out(&out);
  SerializeWithCachedSizes(&coded_out);
  GOOGLE_CHECK(!coded_out.HadError());
  return target + size;
}